

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O1

void free_master(CManager cm,void *vmaster)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  
  if (0 < *(int *)((long)vmaster + 0x34)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      pvVar1 = *(void **)(*(long *)((long)vmaster + 0x38) + lVar2);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
      }
      pvVar1 = *(void **)(*(long *)((long)vmaster + 0x38) + 8 + lVar2);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
      }
      if (*(long *)(*(long *)((long)vmaster + 0x38) + 0x10 + lVar2) != 0) {
        free_attr_list();
      }
      pvVar1 = *(void **)(*(long *)((long)vmaster + 0x38) + 0x18 + lVar2);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x38;
    } while (lVar3 < *(int *)((long)vmaster + 0x34));
  }
  free(*(void **)((long)vmaster + 0x38));
  if (*(void **)((long)vmaster + 0x48) != (void *)0x0) {
    free(*(void **)((long)vmaster + 0x48));
  }
  free(vmaster);
  return;
}

Assistant:

static void
free_master(CManager cm, void *vmaster)
{
    EVmaster master = (EVmaster)vmaster;
    int i;
    for (i=0; i < master->node_count; i++) {
	if (master->nodes[i].name) free(master->nodes[i].name);
	if (master->nodes[i].canonical_name) 
	    free(master->nodes[i].canonical_name);
	if (master->nodes[i].contact_list) 
	    free_attr_list(master->nodes[i].contact_list);
	if (master->nodes[i].str_contact_list) 
	    free(master->nodes[i].str_contact_list);
    }
    free(master->nodes);
    if (master->my_contact_str) free(master->my_contact_str);
    free(master);
}